

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void deleteMissingFiles(Options *options,QDir *srcDir,QDir *dstDir)

{
  long lVar1;
  FILE *pFVar2;
  bool bVar3;
  char cVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  undefined8 *puVar7;
  long lVar8;
  QArrayDataPointer<char16_t> *this;
  QFileInfo *dst;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QFileInfo> local_78;
  QArrayDataPointer<QFileInfo> local_58;
  long local_38;
  
  pFVar2 = _stdout;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    QDir::absolutePath();
    QString::toLocal8Bit((QByteArray *)&local_58,(QString *)&local_78);
    puVar7 = (undefined8 *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    if (puVar7 == (undefined8 *)0x0) {
      puVar7 = &QByteArray::_empty;
    }
    QDir::absolutePath();
    QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_a8);
    pcVar5 = local_90.ptr;
    if (local_90.ptr == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(pFVar2,"Delete missing files %s %s\n",puVar7,pcVar5);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  local_58.size = -0x5555555555555556;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  QDir::entryInfoList(&local_58,srcDir,0x6003,0xffffffff);
  local_78.size = -0x5555555555555556;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QDir::entryInfoList(&local_78,dstDir,0x6003,0xffffffff);
  lVar9 = CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
  lVar1 = lVar9 + local_78.size * 8;
  do {
    if (lVar9 == lVar1) {
      fflush(_stdout);
      QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    for (lVar8 = local_58.size << 3; pFVar2 = _stdout, lVar8 != 0; lVar8 = lVar8 + -8) {
      QFileInfo::fileName();
      QFileInfo::fileName();
      bVar3 = comparesEqual((QString *)&local_90,(QString *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      if (bVar3) {
        cVar4 = QFileInfo::isDir();
        if (cVar4 == '\0') goto LAB_00109ff8;
        QFileInfo::absoluteFilePath();
        QDir::QDir((QDir *)&local_c0,(QString *)&local_90);
        QFileInfo::absoluteFilePath();
        QDir::QDir((QDir *)&local_d8,(QString *)&local_a8);
        deleteMissingFiles(options,(QDir *)&local_c0,(QDir *)&local_d8);
        QDir::~QDir((QDir *)&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        this = &local_c0;
        goto LAB_00109fdc;
      }
    }
    if (options->verbose == true) {
      QFileInfo::fileName();
      QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_a8);
      pcVar5 = local_90.ptr;
      if (local_90.ptr == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QByteArray::_empty;
      }
      QDir::absolutePath();
      QString::toLocal8Bit((QByteArray *)&local_c0,(QString *)&local_d8);
      pcVar6 = local_c0.ptr;
      if (local_c0.ptr == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar2,"%s not found in %s, removing it.\n",pcVar5,pcVar6);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    }
    cVar4 = QFileInfo::isDir();
    if (cVar4 == '\0') {
      QFileInfo::absoluteFilePath();
      QFile::remove((QString *)&local_90);
    }
    else {
      QFileInfo::absolutePath();
      QDir::QDir((QDir *)&local_a8,(QString *)&local_90);
      QDir::removeRecursively();
      this = &local_a8;
LAB_00109fdc:
      QDir::~QDir((QDir *)this);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
LAB_00109ff8:
    lVar9 = lVar9 + 8;
  } while( true );
}

Assistant:

void deleteMissingFiles(const Options &options, const QDir &srcDir, const QDir &dstDir)
{
    if (options.verbose)
        fprintf(stdout, "Delete missing files %s %s\n", qPrintable(srcDir.absolutePath()), qPrintable(dstDir.absolutePath()));

    const QFileInfoList srcEntries = srcDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    const QFileInfoList dstEntries = dstDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    for (const QFileInfo &dst : dstEntries) {
        bool found = false;
        for (const QFileInfo &src : srcEntries)
            if (dst.fileName() == src.fileName()) {
                if (dst.isDir())
                    deleteMissingFiles(options, src.absoluteFilePath(), dst.absoluteFilePath());
                found = true;
                break;
            }

        if (!found) {
            if (options.verbose)
                fprintf(stdout, "%s not found in %s, removing it.\n", qPrintable(dst.fileName()), qPrintable(srcDir.absolutePath()));

            if (dst.isDir())
                QDir{dst.absolutePath()}.removeRecursively();
            else
                QFile::remove(dst.absoluteFilePath());
        }
    }
    fflush(stdout);
}